

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_string_suite::i_string_UTF_16LE_with_BOM(void)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined4 local_17c;
  value local_178 [2];
  undefined1 local_170 [8];
  reader reader;
  string_view view;
  char input [13];
  
  view._M_str._0_5_ = 0x22005bfeff;
  view._M_str._5_3_ = 0xe900;
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         &reader.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,(char *)&view._M_str,0xd);
  trial::protocol::json::basic_reader<char>::basic_reader((basic_reader<char> *)local_170,this);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_17c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcc,"void i_string_suite::i_string_UTF_16LE_with_BOM()",local_178,&local_17c);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_170);
  return;
}

Assistant:

void i_string_UTF_16LE_with_BOM()
{
    const char input[] = "\xFF\xFE\x5B\x00\x22\x00\xE9\x00\x22\x00\x5D\x00";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    // BOM not supported
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}